

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O2

Vec_Wrd_t * Abc_NtkShareSuperAnd(Abc_Obj_t *pObj,int *pCounter)

{
  uint uVar1;
  uint uVar2;
  Abc_Ntk_t *p;
  int *piVar3;
  void **ppvVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  Vec_Wrd_t *p_00;
  word wVar8;
  word wVar9;
  Abc_Obj_t *pAVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int i;
  ulong uVar14;
  bool bVar15;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                  ,0xa6,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
  }
  p = pObj->pNtk;
  p_00 = Vec_WrdAlloc((int)pObj);
  uVar1 = *(uint *)&pObj->field_0x14;
  iVar7 = Abc_ObjToLit(pObj);
  Vec_WrdPush(p_00,(long)iVar7 | (ulong)(uVar1 >> 0xc) << 0x20);
  do {
    iVar7 = p_00->nSize;
    if (iVar7 < 1) {
LAB_002380ce:
      for (iVar11 = 0; iVar11 < iVar7; iVar11 = iVar11 + 1) {
        wVar8 = Vec_WrdEntry(p_00,iVar11);
        Vec_WrdWriteEntry(p_00,iVar11,(long)(int)wVar8);
      }
      return p_00;
    }
    wVar8 = Vec_WrdEntry(p_00,0);
    iVar11 = 1;
    while (iVar12 = iVar7, iVar7 != iVar11) {
      wVar9 = Vec_WrdEntry(p_00,iVar11);
      iVar11 = iVar11 + 1;
      bVar15 = wVar9 <= wVar8;
      wVar8 = wVar9;
      if (bVar15) {
        __assert_fail("Num < NumNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                      ,0xb0,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
      }
    }
    do {
      if (iVar12 < 1) goto LAB_002380ce;
      iVar12 = iVar12 + -1;
      wVar8 = Vec_WrdEntry(p_00,iVar12);
      pAVar10 = Abc_ObjFromLit(p,(int)wVar8);
    } while ((((ulong)pAVar10 & 1) != 0) || ((*(uint *)&pAVar10->field_0x14 & 0xf) != 7));
    Vec_WrdRemove(p_00,wVar8);
    uVar1 = *(uint *)&pAVar10->field_0x14;
    if ((uVar1 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pRoot)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                    ,0xbf,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
    }
    piVar3 = (pAVar10->vFanins).pArray;
    ppvVar4 = pAVar10->pNtk->vObjs->pArray;
    pvVar5 = ppvVar4[*piVar3];
    uVar2 = *(uint *)(((ulong)pvVar5 & 0xfffffffffffffffe) + 0x14);
    uVar13 = uVar2 & 0xf;
    if ((7 < uVar13) || ((0xa4U >> uVar13 & 1) == 0)) {
      __assert_fail("Abc_ObjIsNode(Abc_ObjRegular(pObj0)) || Abc_ObjIsCi(Abc_ObjRegular(pObj0))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                    ,0xc3,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
    }
    pvVar6 = ppvVar4[piVar3[1]];
    uVar14 = (ulong)pvVar6 & 0xfffffffffffffffe;
    uVar13 = *(uint *)(uVar14 + 0x14) & 0xf;
    if ((7 < uVar13) || ((0xa4U >> uVar13 & 1) == 0)) {
      __assert_fail("Abc_ObjIsNode(Abc_ObjRegular(pObj1)) || Abc_ObjIsCi(Abc_ObjRegular(pObj1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                    ,0xc4,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
    }
    iVar7 = Abc_ObjToLit((Abc_Obj_t *)((ulong)pvVar5 ^ (ulong)(uVar1 >> 10 & 1)));
    Vec_WrdPushOrder(p_00,(long)iVar7 | (ulong)(uVar2 >> 0xc) << 0x20);
    uVar2 = *(uint *)(uVar14 + 0x14);
    iVar7 = Abc_ObjToLit((Abc_Obj_t *)((ulong)pvVar6 ^ (ulong)(uVar1 >> 0xb & 1)));
    Vec_WrdPushOrder(p_00,(long)iVar7 | (ulong)(uVar2 >> 0xc) << 0x20);
    *pCounter = *pCounter + 1;
    iVar7 = p_00->nSize;
    iVar12 = 0;
    iVar11 = 0;
    if (0 < iVar7) {
      iVar11 = iVar7;
    }
    i = 0;
    while (iVar11 != iVar12) {
      wVar8 = Vec_WrdEntry(p_00,iVar12);
      if (iVar7 + -1 == iVar12) {
        Vec_WrdWriteEntry(p_00,i,wVar8);
        i = i + 1;
        break;
      }
      iVar12 = iVar12 + 1;
      wVar9 = Vec_WrdEntry(p_00,iVar12);
      if (wVar9 < wVar8) {
        __assert_fail("Num <= NumNext",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcExtract.c"
                      ,0xd2,"Vec_Wrd_t *Abc_NtkShareSuperAnd(Abc_Obj_t *, int *)");
      }
      if ((wVar9 & 1) != 0 && wVar8 + 1 == wVar9) {
        p_00->nSize = 0;
        return p_00;
      }
      if (wVar8 < wVar9) {
        Vec_WrdWriteEntry(p_00,i,wVar8);
        i = i + 1;
      }
    }
    Vec_WrdShrink(p_00,i);
  } while( true );
}

Assistant:

Vec_Wrd_t * Abc_NtkShareSuperAnd( Abc_Obj_t * pObj, int * pCounter )
{
    Abc_Ntk_t * pNtk = Abc_ObjNtk(pObj);
    Abc_Obj_t * pObj0, * pObj1, * pRoot = NULL;
    Vec_Wrd_t * vSuper;
    word Num, NumNext;
    int i, k;
    assert( !Abc_ObjIsComplement(pObj) );
    // start iteration
    vSuper = Vec_WrdAlloc( 10 );
    Vec_WrdPush( vSuper, Abc_NtkSharePack(Abc_ObjLevel(pObj), Abc_ObjToLit(pObj)) );
    while ( Vec_WrdSize(vSuper) > 0 )
    {
        // make sure there are no duplicates
        Num = Vec_WrdEntry( vSuper, 0 );
        Vec_WrdForEachEntryStart( vSuper, NumNext, i, 1 )
        {
            assert( Num < NumNext );
            Num = NumNext;
        }
        // extract AND gate decomposable on the topmost level
        Vec_WrdForEachEntryReverse( vSuper, Num, i )
        {
            pRoot = Abc_ObjFromLit( pNtk, Abc_NtkShareUnpackId(Num) );
            if ( !Abc_ObjIsComplement(pRoot) && Abc_ObjIsNode(pRoot) )
            {
                Vec_WrdRemove( vSuper, Num );
                break;
            }
        }
        if ( i == -1 )
            break;
        assert( Abc_ObjIsNode(pRoot) );
        // extract
        pObj0 = Abc_ObjChild0(pRoot);
        pObj1 = Abc_ObjChild1(pRoot);
        assert( Abc_ObjIsNode(Abc_ObjRegular(pObj0)) || Abc_ObjIsCi(Abc_ObjRegular(pObj0)) );
        assert( Abc_ObjIsNode(Abc_ObjRegular(pObj1)) || Abc_ObjIsCi(Abc_ObjRegular(pObj1)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(Abc_ObjRegular(pObj0)), Abc_ObjToLit(pObj0)) );
        Vec_WrdPushOrder( vSuper, Abc_NtkSharePack(Abc_ObjLevel(Abc_ObjRegular(pObj1)), Abc_ObjToLit(pObj1)) );
        (*pCounter)++;
        // remove duplicates
        k = 0;
        Vec_WrdForEachEntry( vSuper, Num, i )
        {
            if ( i + 1 == Vec_WrdSize(vSuper) )
            {
                Vec_WrdWriteEntry( vSuper, k++, Num );
                break;
            }
            NumNext = Vec_WrdEntry( vSuper, i+1 );
            assert( Num <= NumNext );
            if ( Num + 1 == NumNext && (NumNext & 1) ) // pos_lit & neg_lit = 0
            {
                Vec_WrdClear( vSuper );
                return vSuper;
            }
            if ( Num < NumNext )
                Vec_WrdWriteEntry( vSuper, k++, Num );
        }
        Vec_WrdShrink( vSuper, k );
    }
    Vec_WrdForEachEntry( vSuper, Num, i )
        Vec_WrdWriteEntry( vSuper, i, Abc_NtkShareUnpackId(Num) );
    return vSuper;
}